

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  uint *p1;
  void **ppvVar5;
  int iVar6;
  long lVar7;
  
  if (p->pPars->fCheckMiter == 0) {
    uVar3 = 0;
  }
  else {
    if (p->vCoSimInfo == (Vec_Ptr_t *)0x0) {
      __assert_fail("p->vCoSimInfo != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                    ,0x24e,"int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *)");
    }
    if (p->pPars->fDualOut == 0) {
      for (lVar7 = 0; lVar7 < (long)p->pAig->vCos->nSize - (long)p->pAig->nRegs; lVar7 = lVar7 + 1)
      {
        puVar4 = (uint *)Vec_PtrEntry(p->vCoSimInfo,(int)lVar7);
        iVar2 = p->nWords;
        iVar1 = Cec_ManSimCompareConst(puVar4,iVar2);
        if (iVar1 == 0) {
          if (p->iOut == -1) {
            p->iOut = (int)lVar7;
            iVar2 = Cec_ManSimCompareConstFirstBit(puVar4,iVar2);
            Cec_ManSimSavePattern(p,iVar2);
          }
          ppvVar5 = p->pCexes;
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)calloc((long)p->pAig->vCos->nSize - (long)p->pAig->nRegs,8);
            p->pCexes = ppvVar5;
          }
          if (ppvVar5[lVar7] == (void *)0x0) {
            p->nOuts = p->nOuts + 1;
            ppvVar5[lVar7] = (void *)0x1;
          }
        }
      }
    }
    else {
      iVar2 = p->pAig->vCos->nSize;
      iVar1 = p->pAig->nRegs;
      if ((iVar2 - iVar1 & 1U) != 0) {
        __assert_fail("(Gia_ManPoNum(p->pAig) & 1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                      ,0x252,"int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *)");
      }
      iVar6 = 0;
      for (lVar7 = 0; lVar7 < iVar2 - iVar1; lVar7 = lVar7 + 2) {
        puVar4 = (uint *)Vec_PtrEntry(p->vCoSimInfo,(int)lVar7);
        p1 = (uint *)Vec_PtrEntry(p->vCoSimInfo,(int)lVar7 + 1);
        iVar2 = p->nWords;
        iVar1 = Cec_ManSimCompareEqual(puVar4,p1,iVar2);
        if (iVar1 == 0) {
          if (p->iOut == -1) {
            p->iOut = iVar6;
            iVar2 = Cec_ManSimCompareEqualFirstBit(puVar4,p1,iVar2);
            Cec_ManSimSavePattern(p,iVar2);
          }
          ppvVar5 = p->pCexes;
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)calloc((long)((p->pAig->vCos->nSize - p->pAig->nRegs) / 2),8);
            p->pCexes = ppvVar5;
          }
          if (*(long *)((long)ppvVar5 + lVar7 * 4) == 0) {
            p->nOuts = p->nOuts + 1;
            *(undefined8 *)((long)ppvVar5 + lVar7 * 4) = 1;
          }
        }
        iVar2 = p->pAig->vCos->nSize;
        iVar1 = p->pAig->nRegs;
        iVar6 = iVar6 + 1;
      }
    }
    uVar3 = (uint)(p->pCexes != (void **)0x0);
  }
  return uVar3;
}

Assistant:

int Cec_ManSimAnalyzeOutputs( Cec_ManSim_t * p )
{
    unsigned * pInfo, * pInfo2;
    int i;
    if ( !p->pPars->fCheckMiter )
        return 0;
    assert( p->vCoSimInfo != NULL );
    // compare outputs with 0
    if ( p->pPars->fDualOut )
    {
        assert( (Gia_ManPoNum(p->pAig) & 1) == 0 );
        for ( i = 0; i < Gia_ManPoNum(p->pAig); i++ )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, i );
            pInfo2 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, ++i );
            if ( !Cec_ManSimCompareEqual( pInfo, pInfo2, p->nWords ) )
            {
                if ( p->iOut == -1 )
                {
                    p->iOut = i/2;
                    Cec_ManSimSavePattern( p, Cec_ManSimCompareEqualFirstBit(pInfo, pInfo2, p->nWords) );
                }
                if ( p->pCexes == NULL )
                    p->pCexes = ABC_CALLOC( void *, Gia_ManPoNum(p->pAig)/2 );
                if ( p->pCexes[i/2] == NULL )
                {
                    p->nOuts++;
                    p->pCexes[i/2] = (void *)1;
                }
            }
        }
    }
    else
    {
        for ( i = 0; i < Gia_ManPoNum(p->pAig); i++ )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, i );
            if ( !Cec_ManSimCompareConst( pInfo, p->nWords ) )
            {
                if ( p->iOut == -1 )
                {
                    p->iOut = i;
                    Cec_ManSimSavePattern( p, Cec_ManSimCompareConstFirstBit(pInfo, p->nWords) );
                }
                if ( p->pCexes == NULL )
                    p->pCexes = ABC_CALLOC( void *, Gia_ManPoNum(p->pAig) );
                if ( p->pCexes[i] == NULL )
                {
                    p->nOuts++;
                    p->pCexes[i] = (void *)1;
                }
            }
        }
    }
    return p->pCexes != NULL;
}